

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_HmacSha512_Test::~CryptoUtil_HmacSha512_Test(CryptoUtil_HmacSha512_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, HmacSha512) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data(
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
  ByteData byte_data = CryptoUtil::HmacSha512(key.GetBytes(), data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "33611e4155b594294dac7c61034b5c6f5e49a87167b32ec5ee4bbd7150b6a9357d3021acad45dac9227f458d9576855493ed190fb657cd7a7735c95fc6aa6ba0");
}